

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

uint32_t gravity_object_size(gravity_vm *vm,gravity_object_t *obj)

{
  int iVar1;
  gravity_class_t *pgVar2;
  gravity_gc_callback UNRECOVERED_JUMPTABLE;
  uint32_t uVar3;
  
  if (((obj == (gravity_object_t *)0x0) || (pgVar2 = obj->isa, pgVar2 == (gravity_class_t *)0x0)) ||
     ((obj->gc).visited != false)) {
    return 0;
  }
  UNRECOVERED_JUMPTABLE = (obj->gc).size;
  if (UNRECOVERED_JUMPTABLE != (gravity_gc_callback)0x0) {
    uVar3 = (*UNRECOVERED_JUMPTABLE)(vm,obj);
    return uVar3;
  }
  if (pgVar2 == gravity_class_class) {
    uVar3 = gravity_class_size(vm,obj);
    return uVar3;
  }
  if (pgVar2 == gravity_class_function) {
    uVar3 = gravity_function_size(vm,(gravity_function_t *)obj);
    return uVar3;
  }
  if (pgVar2 == gravity_class_closure) {
    uVar3 = gravity_closure_size(vm,(gravity_closure_t *)obj);
    return uVar3;
  }
  if (pgVar2 == gravity_class_instance) {
    uVar3 = gravity_instance_size(vm,(gravity_instance_t *)obj);
    return uVar3;
  }
  if (pgVar2 != gravity_class_list) {
    if (pgVar2 == gravity_class_map) {
      uVar3 = gravity_map_size(vm,(gravity_map_t *)obj);
      return uVar3;
    }
    if (pgVar2 == gravity_class_fiber) {
      uVar3 = gravity_fiber_size(vm,(gravity_fiber_t *)obj);
      return uVar3;
    }
    if (pgVar2 == gravity_class_range) {
      (obj->gc).visited = false;
      uVar3 = 0x40;
    }
    else {
      if (pgVar2 == gravity_class_module) {
        uVar3 = gravity_module_size(vm,(gravity_module_t *)obj);
        return uVar3;
      }
      if (pgVar2 == gravity_class_string) {
        iVar1 = *(int *)&obj->has_outer;
        (obj->gc).visited = false;
        return iVar1 + 0x48;
      }
      if (pgVar2 != gravity_class_upvalue) {
        return 0;
      }
      (obj->gc).visited = false;
      uVar3 = 0x50;
    }
    return uVar3;
  }
  uVar3 = gravity_list_size(vm,(gravity_list_t *)obj);
  return uVar3;
}

Assistant:

uint32_t gravity_object_size (gravity_vm *vm, gravity_object_t *obj) {
    if ((!obj) || (!OBJECT_IS_VALID(obj))) return 0;
    
    // check if object has already been visited (to avoid infinite loop)
    if (obj->gc.visited) return 0;
    
    if (obj->gc.size) return obj->gc.size(vm, obj);
    else if (OBJECT_ISA_CLASS(obj)) return gravity_class_size(vm, (gravity_class_t *)obj);
    else if (OBJECT_ISA_FUNCTION(obj)) return gravity_function_size(vm, (gravity_function_t *)obj);
    else if (OBJECT_ISA_CLOSURE(obj)) return gravity_closure_size(vm, (gravity_closure_t *)obj);
    else if (OBJECT_ISA_INSTANCE(obj)) return gravity_instance_size(vm, (gravity_instance_t *)obj);
    else if (OBJECT_ISA_LIST(obj)) return gravity_list_size(vm, (gravity_list_t *)obj);
    else if (OBJECT_ISA_MAP(obj)) return gravity_map_size(vm, (gravity_map_t *)obj);
    else if (OBJECT_ISA_FIBER(obj)) return gravity_fiber_size(vm, (gravity_fiber_t *)obj);
    else if (OBJECT_ISA_RANGE(obj)) return gravity_range_size(vm, (gravity_range_t *)obj);
    else if (OBJECT_ISA_MODULE(obj)) return gravity_module_size(vm, (gravity_module_t *)obj);
    else if (OBJECT_ISA_STRING(obj)) return gravity_string_size(vm, (gravity_string_t *)obj);
    else if (OBJECT_ISA_UPVALUE(obj)) return gravity_upvalue_size(vm, (gravity_upvalue_t *)obj);
    return 0;
}